

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O3

SearchResult __thiscall
anon_unknown.dwarf_656d3::CliqueRunner::expand<true>
          (CliqueRunner *this,int depth,unsigned_long_long *nodes,unsigned_long_long *find_nodes,
          unsigned_long_long *prove_nodes,vector<int,_std::allocator<int>_> *c,SVOBitset *p,
          conditional_t<true,_const_SVOBitset_&,_int> a,int spacepos)

{
  size_t *psVar1;
  pointer *ppiVar2;
  pointer plVar3;
  BitWord BVar4;
  vector<int,_std::allocator<int>_> *v_00;
  CliqueParams *pCVar5;
  size_t sVar6;
  pointer plVar7;
  Proof *pPVar8;
  bool bVar9;
  int iVar10;
  SearchResult SVar11;
  void *pvVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  int *piVar14;
  _List_node_base *p_Var15;
  SVOBitset *pSVar16;
  byte bVar17;
  undefined8 uVar18;
  long lVar19;
  iterator iVar20;
  int v_1;
  int iVar21;
  int *piVar22;
  int iVar23;
  undefined4 in_register_00000034;
  conditional_t<true,_const_SVOBitset_&,_int> pSVar24;
  uint uVar25;
  _Self __tmp_1;
  pointer plVar26;
  int iVar27;
  ulong uVar28;
  SearchResult local_1b8;
  int v;
  uint local_1ac;
  int *local_1a8;
  CliqueRunner *local_1a0;
  Incumbent *local_198;
  ulong local_190;
  int *local_188;
  undefined8 local_180;
  SVOBitset p_left;
  ulong local_e0;
  SVOBitset q;
  
  local_180 = CONCAT44(in_register_00000034,depth);
  *nodes = *nodes + 1;
  *prove_nodes = *prove_nodes + 1;
  local_1ac = 0;
  piVar14 = this->space + spacepos;
  local_188 = this->space + (this->size + spacepos);
  local_1a8 = piVar14;
  local_1a0 = this;
  if ((c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start ==
      (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish)
  {
    colour_class_order(this,p,piVar14,local_188,(int *)&local_1ac);
    local_e0 = (ulong)local_1ac;
  }
  else {
    gss::innards::SVOBitset::SVOBitset(&p_left,p);
    gss::innards::SVOBitset::intersect_with_complement(&p_left,a);
    bVar9 = gss::innards::SVOBitset::any(&p_left);
    iVar21 = 0;
    local_e0 = 0;
    if (bVar9) {
      local_e0 = 0;
      iVar21 = 0;
      do {
        q.n_words = p_left.n_words;
        if ((ulong)p_left.n_words < 0x11) {
          q._data._8_8_ = p_left._data.short_data[1];
          q._data.short_data[0] = p_left._data.short_data[0];
          q._data.short_data[2] = p_left._data.short_data[2];
          q._data._24_40_ = p_left._data._24_40_;
          q._data.short_data[8] = p_left._data.short_data[8];
          q._data.short_data[9] = p_left._data.short_data[9];
          q._data.short_data[10] = p_left._data.short_data[10];
          q._data.short_data[0xb] = p_left._data.short_data[0xb];
          q._data.short_data[0xc] = p_left._data.short_data[0xc];
          q._data.short_data[0xd] = p_left._data.short_data[0xd];
          q._data.short_data[0xe] = p_left._data.short_data[0xe];
          q._data.short_data[0xf] = p_left._data.short_data[0xf];
        }
        else {
          uVar28 = (ulong)p_left.n_words << 3;
          pvVar12 = operator_new__(uVar28);
          q._data.long_data = (BitWord *)pvVar12;
          memmove(pvVar12,p_left._data.long_data,uVar28);
        }
        iVar21 = iVar21 + 1;
        bVar9 = gss::innards::SVOBitset::any(&q);
        if (bVar9) {
          local_e0 = (ulong)(int)local_e0;
          do {
            uVar25 = q.n_words;
            uVar28 = (ulong)q.n_words;
            uVar18 = &q;
            if (0x10 < uVar28) {
              uVar18 = q._data.short_data[0];
            }
            iVar27 = -1;
            if (uVar28 != 0) {
              lVar19 = 0;
LAB_001148f0:
              BVar4 = (((SVOBitset *)uVar18)->_data).short_data[0];
              if (BVar4 == 0) goto code_r0x001148f8;
              iVar27 = 0;
              for (; (BVar4 & 1) == 0; BVar4 = BVar4 >> 1 | 0x8000000000000000) {
                iVar27 = iVar27 + 1;
              }
              iVar27 = iVar27 - (int)lVar19;
            }
LAB_00114912:
            uVar18 = &p_left;
            if (0x10 < p_left.n_words) {
              uVar18 = p_left._data.short_data[0];
            }
            bVar17 = (byte)iVar27 & 0x3f;
            uVar28 = -2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17;
            iVar10 = iVar27 + 0x3f;
            if (-1 < iVar27) {
              iVar10 = iVar27;
            }
            (((SVOBitset *)uVar18)->_data).short_data[iVar10 >> 6] =
                 (((SVOBitset *)uVar18)->_data).short_data[iVar10 >> 6] & uVar28;
            uVar18 = &q;
            if (0x10 < uVar25) {
              uVar18 = q._data.short_data[0];
            }
            (((SVOBitset *)uVar18)->_data).short_data[iVar10 >> 6] =
                 (((SVOBitset *)uVar18)->_data).short_data[iVar10 >> 6] & uVar28;
            gss::innards::SVOBitset::intersect_with_complement
                      (&q,(local_1a0->adj).
                          super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar27);
            local_188[local_e0] = iVar21;
            local_1a8[local_e0] = iVar27;
            local_e0 = local_e0 + 1;
            bVar9 = gss::innards::SVOBitset::any(&q);
          } while (bVar9);
        }
        if ((0x10 < q.n_words) && (q._data.short_data[0] != 0)) {
          operator_delete__(q._data.long_data);
        }
        bVar9 = gss::innards::SVOBitset::any(&p_left);
      } while (bVar9);
      local_1ac = (uint)local_e0;
    }
    gss::innards::SVOBitset::operator=(&p_left,p);
    gss::innards::SVOBitset::operator&=(&p_left,a);
    bVar9 = gss::innards::SVOBitset::any(&p_left);
    if (bVar9) {
      do {
        q.n_words = p_left.n_words;
        if ((ulong)p_left.n_words < 0x11) {
          q._data._8_8_ = p_left._data.short_data[1];
          q._data.short_data[0] = p_left._data.short_data[0];
          q._data.short_data[2] = p_left._data.short_data[2];
          q._data._24_40_ = p_left._data._24_40_;
          q._data.short_data[8] = p_left._data.short_data[8];
          q._data.short_data[9] = p_left._data.short_data[9];
          q._data.short_data[10] = p_left._data.short_data[10];
          q._data.short_data[0xb] = p_left._data.short_data[0xb];
          q._data.short_data[0xc] = p_left._data.short_data[0xc];
          q._data.short_data[0xd] = p_left._data.short_data[0xd];
          q._data.short_data[0xe] = p_left._data.short_data[0xe];
          q._data.short_data[0xf] = p_left._data.short_data[0xf];
        }
        else {
          uVar28 = (ulong)p_left.n_words << 3;
          pvVar12 = operator_new__(uVar28);
          q._data.long_data = (BitWord *)pvVar12;
          memmove(pvVar12,p_left._data.long_data,uVar28);
        }
        iVar21 = iVar21 + 1;
        bVar9 = gss::innards::SVOBitset::any(&q);
        if (bVar9) {
          local_e0 = (ulong)(int)local_e0;
          do {
            uVar25 = q.n_words;
            uVar28 = (ulong)q.n_words;
            uVar18 = &q;
            if (0x10 < uVar28) {
              uVar18 = q._data.short_data[0];
            }
            iVar27 = -1;
            if (uVar28 != 0) {
              lVar19 = 0;
LAB_00114ab4:
              BVar4 = (((SVOBitset *)uVar18)->_data).short_data[0];
              if (BVar4 == 0) goto code_r0x00114abc;
              iVar27 = 0;
              for (; (BVar4 & 1) == 0; BVar4 = BVar4 >> 1 | 0x8000000000000000) {
                iVar27 = iVar27 + 1;
              }
              iVar27 = iVar27 - (int)lVar19;
            }
LAB_00114ad6:
            uVar18 = &p_left;
            if (0x10 < p_left.n_words) {
              uVar18 = p_left._data.short_data[0];
            }
            bVar17 = (byte)iVar27 & 0x3f;
            uVar28 = -2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17;
            iVar10 = iVar27 + 0x3f;
            if (-1 < iVar27) {
              iVar10 = iVar27;
            }
            (((SVOBitset *)uVar18)->_data).short_data[iVar10 >> 6] =
                 (((SVOBitset *)uVar18)->_data).short_data[iVar10 >> 6] & uVar28;
            uVar18 = &q;
            if (0x10 < uVar25) {
              uVar18 = q._data.short_data[0];
            }
            (((SVOBitset *)uVar18)->_data).short_data[iVar10 >> 6] =
                 (((SVOBitset *)uVar18)->_data).short_data[iVar10 >> 6] & uVar28;
            gss::innards::SVOBitset::intersect_with_complement
                      (&q,(local_1a0->adj).
                          super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar27);
            local_188[local_e0] = iVar21;
            local_1a8[local_e0] = iVar27;
            local_e0 = local_e0 + 1;
            bVar9 = gss::innards::SVOBitset::any(&q);
          } while (bVar9);
        }
        if ((0x10 < q.n_words) && (q._data.short_data[0] != 0)) {
          operator_delete__(q._data.long_data);
        }
        bVar9 = gss::innards::SVOBitset::any(&p_left);
      } while (bVar9);
      local_1ac = (uint)local_e0;
    }
    piVar14 = local_1a8;
    this = local_1a0;
    if ((0x10 < p_left.n_words) && (p_left._data.short_data[0] != 0)) {
      operator_delete__(p_left._data.long_data);
      this = local_1a0;
    }
  }
  local_198 = &this->incumbent;
  iVar21 = (int)local_180 + 1;
  local_e0 = local_e0 & 0xffffffff;
  do {
    local_190 = local_e0;
    if ((int)local_e0 < 1) {
LAB_0011534b:
      (*((this->params->restarts_schedule)._M_t.
         super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>.
         _M_t.
         super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
         .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
        _vptr_RestartsSchedule[2])();
      iVar21 = (*((this->params->restarts_schedule)._M_t.
                  super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                  .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
                 _vptr_RestartsSchedule[4])();
      if ((char)iVar21 == '\0') {
        return Complete;
      }
      post_nogood(this,(vector<int,_std::allocator<int>_> *)
                       (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start);
      return Restart;
    }
    bVar9 = gss::Timeout::should_abort
                      ((this->params->timeout).
                       super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (bVar9) {
      return Aborted;
    }
    v_00 = (vector<int,_std::allocator<int>_> *)
           (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
    iVar20._M_current =
         (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    local_e0 = local_190 - 1;
    if ((ulong)((long)local_188[local_e0] + ((long)iVar20._M_current - (long)v_00 >> 2)) <=
        (ulong)local_198->value) {
      if ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        uVar28 = 0;
        p_left._data.short_data[0] = 0;
        p_left._data.short_data[1] = 0;
        p_left._data.short_data[2] = 0;
        do {
          if ((uVar28 == 0) || (local_188[uVar28 - 1] != local_188[uVar28])) {
            if (p_left._data.short_data[1] == p_left._data.short_data[2]) {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::_M_realloc_insert<>
                        ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&p_left,(iterator)p_left._data.short_data[1]);
            }
            else {
              *(undefined8 *)(p_left._data.short_data[1] + 0x10) = 0;
              *(undefined8 *)p_left._data.short_data[1] = 0;
              *(undefined8 *)(p_left._data.short_data[1] + 8) = 0;
              p_left._data.short_data[1] = p_left._data.short_data[1] + 0x18;
            }
          }
          piVar22 = (this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + piVar14[uVar28];
          iVar20._M_current = *(int **)(p_left._data.short_data[1] - 0x10);
          if (iVar20._M_current == *(int **)(p_left._data.short_data[1] - 8)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)(p_left._data.short_data[1] - 0x18),iVar20
                       ,piVar22);
          }
          else {
            *iVar20._M_current = *piVar22;
            *(int **)(p_left._data.short_data[1] - 0x10) = iVar20._M_current + 1;
          }
          uVar28 = uVar28 + 1;
        } while (local_190 != uVar28);
        gss::innards::Proof::colour_bound
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)&p_left);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&p_left);
      }
      goto LAB_0011534b;
    }
    v = piVar14[local_e0];
    if (v_00 != (vector<int,_std::allocator<int>_> *)iVar20._M_current) {
      pSVar24 = a;
      if (0x10 < a->n_words) {
        pSVar24 = (conditional_t<true,_const_SVOBitset_&,_int>)(a->_data).short_data[0];
      }
      uVar25 = v + 0x3f;
      if (-1 < v) {
        uVar25 = v;
      }
      if (((pSVar24->_data).short_data[(int)uVar25 >> 6] >> ((ulong)(uint)v & 0x3f) & 1) == 0) {
        if ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          unpermute((vector<int,_std::allocator<int>_> *)&p_left,this,v_00);
          uVar28 = 0;
          do {
            pPVar8 = (this->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            unpermute((vector<int,_std::allocator<int>_> *)&q,this,
                      (vector<int,_std::allocator<int>_> *)
                      (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start);
            gss::innards::Proof::not_connected_in_underlying_graph
                      (pPVar8,(vector<int,_std::allocator<int>_> *)&q,
                       (this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[local_1a8[uVar28]]);
            if (q._data.short_data[0] != 0) {
              operator_delete(q._data.long_data,q._data.short_data[2] - q._data._0_8_);
            }
            uVar28 = uVar28 + 1;
          } while (local_190 != uVar28);
          gss::innards::Proof::start_level
                    ((this->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (int)local_180);
          pPVar8 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          unpermute((vector<int,_std::allocator<int>_> *)&q,this,
                    (vector<int,_std::allocator<int>_> *)
                    (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start);
          gss::innards::Proof::backtrack_from_binary_variables
                    (pPVar8,(vector<int,_std::allocator<int>_> *)&q);
          if (q._data.short_data[0] != 0) {
            operator_delete(q._data.long_data,q._data.short_data[2] - q._data._0_8_);
          }
          gss::innards::Proof::forget_level
                    ((this->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     iVar21);
          if (p_left._data.short_data[0] != 0) {
            operator_delete(p_left._data.long_data,p_left._data.short_data[2] - p_left._data._0_8_);
          }
        }
        goto LAB_0011534b;
      }
    }
    if (iVar20._M_current ==
        (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)c,iVar20,&v);
    }
    else {
      *iVar20._M_current = v;
      (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
           iVar20._M_current + 1;
    }
    pCVar5 = this->params;
    if ((pCVar5->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == false) {
      bVar17 = (pCVar5->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>.
               _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged;
      if ((bool)bVar17 != false) goto LAB_00114cd7;
      pPVar8 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (((pPVar8 != (Proof *)0x0) &&
          ((ulong)local_198->value <
           (ulong)((long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2))) &&
         (pCVar5->proof_is_for_hom == false)) {
        gss::innards::Proof::start_level(pPVar8,0);
        pPVar8 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        unpermute_and_finish
                  ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&p_left,
                   this,(vector<int,_std::allocator<int>_> *)
                        (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start);
        gss::innards::Proof::new_incumbent
                  (pPVar8,(vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                          &p_left);
        if (p_left._data.short_data[0] != 0) {
          operator_delete(p_left._data.long_data,p_left._data.short_data[2] - p_left._data._0_8_);
        }
        gss::innards::Proof::start_level
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,iVar21);
      }
      Incumbent::update(local_198,c,find_nodes,prove_nodes);
    }
    else {
      if ((pCVar5->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value <= local_198->value)
      goto LAB_00115209;
      bVar17 = (pCVar5->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>.
               _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged;
LAB_00114cd7:
      if (((bVar17 & 1) != 0) &&
         ((pCVar5->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value <= local_198->value)) {
LAB_00115209:
        pPVar8 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (pPVar8 != (Proof *)0x0) {
          unpermute((vector<int,_std::allocator<int>_> *)&p_left,this,
                    (vector<int,_std::allocator<int>_> *)
                    (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start);
          gss::innards::Proof::post_solution(pPVar8,(vector<int,_std::allocator<int>_> *)&p_left);
          if (p_left._data.short_data[0] != 0) {
            operator_delete(p_left._data.long_data,p_left._data.short_data[2] - p_left._data._0_8_);
          }
        }
        return DecidedTrue;
      }
    }
    gss::innards::SVOBitset::SVOBitset(&p_left,p);
    gss::innards::SVOBitset::operator&=
              (&p_left,(this->adj).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       ._M_impl.super__Vector_impl_data._M_start + v);
    iVar10 = (*((this->params->restarts_schedule)._M_t.
                super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
               _vptr_RestartsSchedule[5])();
    iVar27 = v;
    if ((char)iVar10 != '\0') {
      plVar3 = (local_1a0->watches).table.data.
               super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + v;
      plVar26 = *(pointer *)
                 &(plVar3->
                  super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                  )._M_impl;
LAB_00114e06:
      if (plVar26 != plVar3) {
        sVar6 = (plVar26->
                super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                )._M_impl._M_node._M_size;
        piVar14 = *(int **)(sVar6 + 0x10);
        iVar10 = *piVar14;
        if (iVar10 != iVar27) {
          *piVar14 = piVar14[1];
          piVar14[1] = iVar10;
        }
        piVar22 = piVar14 + 2;
        if (piVar22 != *(int **)(sVar6 + 0x18)) {
          do {
            piVar14 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
            q._data.short_data[0]._0_4_ = *piVar22;
            _Var13 = std::
                     __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                               ((c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start,piVar14,&q);
            if (_Var13._M_current == piVar14) {
              piVar14 = *(int **)(sVar6 + 0x10);
              iVar10 = *piVar14;
              *piVar14 = *piVar22;
              *piVar22 = iVar10;
              iVar10 = *piVar14;
              plVar7 = (local_1a0->watches).table.data.
                       super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              p_Var15 = (_List_node_base *)operator_new(0x18);
              p_Var15[1]._M_next =
                   (_List_node_base *)
                   (plVar26->
                   super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                   )._M_impl._M_node._M_size;
              std::__detail::_List_node_base::_M_hook(p_Var15);
              psVar1 = &plVar7[iVar10].
                        super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                        ._M_impl._M_node._M_size;
              *psVar1 = *psVar1 + 1;
              plVar7 = *(pointer *)
                        &(plVar26->
                         super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                         )._M_impl;
              psVar1 = &(plVar3->
                        super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                        )._M_impl._M_node._M_size;
              *psVar1 = *psVar1 - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(plVar26,0x18);
              plVar26 = plVar7;
              goto LAB_00114e06;
            }
            piVar22 = piVar22 + 1;
          } while (piVar22 != *(int **)(sVar6 + 0x18));
          piVar14 = *(int **)(sVar6 + 0x10);
        }
        uVar18 = &p_left;
        if (0x10 < p_left.n_words) {
          uVar18 = p_left._data.short_data[0];
        }
        iVar10 = piVar14[1];
        bVar17 = (byte)iVar10 & 0x3f;
        iVar23 = iVar10 + 0x3f;
        if (-1 < iVar10) {
          iVar23 = iVar10;
        }
        (((SVOBitset *)uVar18)->_data).short_data[iVar23 >> 6] =
             (((SVOBitset *)uVar18)->_data).short_data[iVar23 >> 6] &
             (-2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17);
        plVar26 = *(pointer *)
                   &(plVar26->
                    super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                    )._M_impl;
        goto LAB_00114e06;
      }
    }
    this = local_1a0;
    piVar14 = local_1a8;
    pPVar8 = (local_1a0->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (pPVar8 != (Proof *)0x0) {
      gss::innards::Proof::start_level(pPVar8,iVar21);
    }
    bVar9 = gss::innards::SVOBitset::any(&p_left);
    if (bVar9) {
      gss::innards::SVOBitset::SVOBitset(&q,a);
      gss::innards::SVOBitset::operator|=
                (&q,(this->connected_table).
                    super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                    ._M_impl.super__Vector_impl_data._M_start + v);
      SVar11 = expand<true>(this,iVar21,nodes,find_nodes,prove_nodes,c,&p_left,&q,
                            spacepos + this->size * 2);
      bVar9 = false;
      if (SVar11 != Aborted) {
        if (SVar11 == Restart) {
          SVar11 = Restart;
          iVar20._M_current =
               (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish + -1;
          (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar20._M_current;
          uVar28 = (ulong)local_1ac;
          while( true ) {
            if ((int)uVar28 <= (int)local_190) break;
            uVar28 = (ulong)((int)uVar28 - 1);
            if (iVar20._M_current ==
                (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)c,iVar20,local_1a8 + uVar28);
            }
            else {
              *iVar20._M_current = local_1a8[uVar28];
              (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish = iVar20._M_current + 1;
            }
            post_nogood(this,(vector<int,_std::allocator<int>_> *)
                             (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start);
            iVar20._M_current =
                 (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish + -1;
            (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar20._M_current;
          }
          bVar9 = false;
        }
        else {
          bVar9 = false;
          if (SVar11 != DecidedTrue) {
            bVar9 = true;
            SVar11 = local_1b8;
          }
        }
      }
      if ((0x10 < q.n_words) && (q._data.short_data[0] != 0)) {
        operator_delete__(q._data.long_data);
      }
      piVar14 = local_1a8;
      local_1b8 = SVar11;
      if (bVar9) goto LAB_0011506b;
      bVar9 = false;
    }
    else {
LAB_0011506b:
      pPVar8 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (pPVar8 != (Proof *)0x0) {
        gss::innards::Proof::start_level(pPVar8,(int)local_180);
        pPVar8 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        unpermute((vector<int,_std::allocator<int>_> *)&q,this,
                  (vector<int,_std::allocator<int>_> *)
                  (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                  ._M_start);
        gss::innards::Proof::backtrack_from_binary_variables
                  (pPVar8,(vector<int,_std::allocator<int>_> *)&q);
        if (q._data.short_data[0] != 0) {
          operator_delete(q._data.long_data,q._data.short_data[2] - q._data._0_8_);
        }
        gss::innards::Proof::forget_level
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,iVar21);
      }
      ppiVar2 = &(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish;
      *ppiVar2 = *ppiVar2 + -1;
      pSVar16 = p;
      if (0x10 < p->n_words) {
        pSVar16 = (SVOBitset *)(p->_data).short_data[0];
      }
      bVar9 = true;
      bVar17 = (byte)v & 0x3f;
      iVar27 = v + 0x3f;
      if (-1 < v) {
        iVar27 = v;
      }
      (pSVar16->_data).short_data[iVar27 >> 6] =
           (pSVar16->_data).short_data[iVar27 >> 6] &
           (-2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17);
    }
    if ((0x10 < p_left.n_words) && (p_left._data.short_data[0] != 0)) {
      operator_delete__(p_left._data.long_data);
    }
    if (!bVar9) {
      return local_1b8;
    }
  } while( true );
code_r0x001148f8:
  lVar19 = lVar19 + -0x40;
  uVar18 = (long)&((SVOBitset *)uVar18)->_data + 8;
  if (uVar28 * 0x40 + lVar19 == 0) goto LAB_00114912;
  goto LAB_001148f0;
code_r0x00114abc:
  lVar19 = lVar19 + -0x40;
  uVar18 = (long)&((SVOBitset *)uVar18)->_data + 8;
  if (uVar28 * 0x40 + lVar19 == 0) goto LAB_00114ad6;
  goto LAB_00114ab4;
}

Assistant:

auto expand(
            int depth,
            unsigned long long & nodes,
            unsigned long long & find_nodes,
            unsigned long long & prove_nodes,
            vector<int> & c,
            SVOBitset & p,
            conditional_t<connected_, const SVOBitset &, int> a,
            int spacepos) -> SearchResult
        {
            ++nodes;
            ++prove_nodes;

            // initial colouring
            int * p_order = &space[spacepos];
            int * p_bounds = &space[spacepos + size];

            int p_end = 0;

            if constexpr (connected_) {
                if (! c.empty())
                    connected_colour_class_order(p, a, p_order, p_bounds, p_end);
                else
                    colour_class_order(p, p_order, p_bounds, p_end);
            }
            else {
                switch (params.colour_class_order) {
                case ColourClassOrder::ColourOrder: colour_class_order(p, p_order, p_bounds, p_end); break;
                case ColourClassOrder::SingletonsFirst: colour_class_order_2df(p, p_order, p_bounds, &space[spacepos + 2 * size], p_end); break;
                case ColourClassOrder::Sorted: colour_class_order_sorted(p, p_order, p_bounds, p_end); break;
                }
            }

            // for each v in p... (v comes later)
            for (int n = p_end - 1; n >= 0; --n) {
                // bound, timeout or early exit?
                if (params.timeout->should_abort())
                    return SearchResult::Aborted;

                if (c.size() + p_bounds[n] <= incumbent.value) {
                    if (proof) {
                        vector<vector<int>> colour_classes;
                        for (int v = 0; v <= n; ++v) {
                            if (0 == v || p_bounds[v - 1] != p_bounds[v])
                                colour_classes.emplace_back();
                            colour_classes.back().push_back(order[p_order[v]]);
                        }
                        proof->colour_bound(colour_classes);
                    }
                    break;
                }

                // if we've used k colours to colour k vertices, it's a clique. this isn't (I think?) a
                // valid shortcut in the connected case.
                if constexpr (! connected_) {
                    if (p_bounds[n] == n + 1) {
                        auto c_save = c;
                        for (; n >= 0; --n)
                            c.push_back(p_order[n]);
                        incumbent.update(c, find_nodes, prove_nodes);

                        if (proof && ! params.decide) {
                            proof->start_level(0);
                            proof->new_incumbent(unpermute_and_finish(c));
                            proof->start_level(depth + 1);
                        }

                        if ((params.decide && incumbent.value >= *params.decide) ||
                            (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                            if (proof)
                                proof->post_solution(unpermute(c));

                            return SearchResult::DecidedTrue;
                        }

                        c = move(c_save);

                        break;
                    }
                }

                auto v = p_order[n];

                if constexpr (connected_) {
                    if ((! c.empty()) && (! a.test(v))) {
                        // none of the remaining vertices can give a connected underlying graph
                        if (proof) {
                            auto c_unpermuted = unpermute(c);
                            for (int v = 0; v <= n; ++v)
                                proof->not_connected_in_underlying_graph(unpermute(c), order[p_order[v]]);

                            proof->start_level(depth);
                            proof->backtrack_from_binary_variables(unpermute(c));
                            proof->forget_level(depth + 1);
                        }

                        break;
                    }
                }

                // consider taking v
                c.push_back(v);

                if (params.decide || params.stop_after_finding) {
                    if ((params.decide && incumbent.value >= *params.decide) ||
                        (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                        if (proof)
                            proof->post_solution(unpermute(c));

                        return SearchResult::DecidedTrue;
                    }
                }
                else {
                    if (proof && c.size() > incumbent.value && ! params.proof_is_for_hom) {
                        proof->start_level(0);
                        proof->new_incumbent(unpermute_and_finish(c));
                        proof->start_level(depth + 1);
                    }
                    incumbent.update(c, find_nodes, prove_nodes);
                }

                // filter p to contain vertices adjacent to v
                SVOBitset new_p = p;
                new_p &= adj[v];

                if (params.restarts_schedule->might_restart())
                    watches.propagate(
                        v,
                        [&](int literal) { return c.end() == find(c.begin(), c.end(), literal); },
                        [&](int literal) { new_p.reset(literal); });

                if (proof)
                    proof->start_level(depth + 1);

                if (new_p.any()) {
                    auto new_a = a;

                    if constexpr (connected_) {
                        new_a |= connected_table[v];
                    }

                    switch (expand<connected_>(depth + 1, nodes, find_nodes, prove_nodes, c, new_p, new_a, spacepos + 2 * size)) {
                    case SearchResult::Aborted:
                        return SearchResult::Aborted;

                    case SearchResult::DecidedTrue:
                        return SearchResult::DecidedTrue;

                    case SearchResult::Complete:
                        break;

                    case SearchResult::Restart:
                        // restore assignments before posting nogoods, it's easier
                        c.pop_back();

                        // post nogoods for everything we've done so far
                        for (int m = p_end - 1; m > n; --m) {
                            c.push_back(p_order[m]);
                            post_nogood(c);
                            c.pop_back();
                        }

                        return SearchResult::Restart;
                    }
                }

                if (proof) {
                    proof->start_level(depth);
                    proof->backtrack_from_binary_variables(unpermute(c));
                    proof->forget_level(depth + 1);
                }

                // now consider not taking v
                c.pop_back();
                p.reset(v);
            }

            params.restarts_schedule->did_a_backtrack();
            if (params.restarts_schedule->should_restart()) {
                post_nogood(c);
                return SearchResult::Restart;
            }
            else
                return SearchResult::Complete;
        }